

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_constant::preprocess
          (method_constant *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  const_reference pptVar1;
  tree_type<cs::token_base_*> *tree;
  bool in_stack_000000e6;
  bool in_stack_000000e7;
  instance_type *in_stack_000000e8;
  iterator in_stack_000000f0;
  undefined1 in_stack_00000206;
  undefined1 in_stack_00000207;
  instance_type *in_stack_00000208;
  iterator in_stack_00000210;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffb8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffc0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_ffffffffffffffd0);
  pptVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
  token_expr::get_tree((token_expr *)*pptVar1);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x562a21);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x562a2d);
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffffb8);
  instance_type::check_define_var
            (in_stack_00000208,in_stack_00000210,(bool)in_stack_00000207,(bool)in_stack_00000206);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x562a61);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x562a6d);
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffffb8);
  instance_type::parse_define_var
            (in_stack_000000e8,in_stack_000000f0,in_stack_000000e7,in_stack_000000e6);
  return;
}

Assistant:

void method_constant::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		context->instance->check_define_var(tree.root(), false, true);
		context->instance->parse_define_var(tree.root(), true);
	}